

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

int IDAGetQuadB(void *ida_mem,int which,sunrealtype *tret,N_Vector qB)

{
  void *ida_mem_00;
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  int *piVar3;
  long nstB;
  long local_30;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar1 = 0x780;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar2 = -0x65;
    error_code = -0x65;
    iVar1 = 0x789;
  }
  else {
    if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
      for (piVar3 = *(int **)(*(long *)((long)ida_mem + 0x840) + 0x30);
          (piVar3 != (int *)0x0 && (*piVar3 != which)); piVar3 = *(int **)(piVar3 + 0x20)) {
      }
      ida_mem_00 = *(void **)(piVar3 + 4);
      iVar1 = IDAGetNumSteps(ida_mem_00,&local_30);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_30 != 0) {
        iVar1 = IDAGetQuad(ida_mem_00,tret,qB);
        return iVar1;
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)(piVar3 + 4) + 0x300),qB);
      *tret = *(sunrealtype *)(piVar3 + 0x1a);
      return 0;
    }
    msgfmt = "Illegal value for which.";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar1 = 0x792;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDAGetQuadB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDAGetQuadB(void* ida_mem, int which, sunrealtype* tret, N_Vector qB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;
  int flag;
  long int nstB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return IDA_MEM_NULL;
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* If the integration for this backward problem has not started yet,
   * simply return the current value of qB (i.e. the final conditions) */

  flag = IDAGetNumSteps(ida_memB, &nstB);
  if (IDA_SUCCESS != flag) { return (flag); }

  if (nstB == 0)
  {
    N_VScale(ONE, IDAB_mem->IDA_mem->ida_phiQ[0], qB);
    *tret = IDAB_mem->ida_tout;
  }
  else { flag = IDAGetQuad(ida_memB, tret, qB); }
  return (flag);
}